

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O0

void shade_rect_top_bottom(int x,int y,int w,int h,Fl_Color fg1,Fl_Color fg2,float th)

{
  int h_00;
  Fl_Color FVar1;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  float k_1;
  float k;
  float step_size_bottom;
  float step_size_top;
  int j;
  int h_flat;
  int h_bottom;
  int h_top;
  float th_local;
  Fl_Color fg2_local;
  Fl_Color fg1_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  if (h / 2 < 0x14) {
    local_48 = h / 2;
  }
  else {
    local_48 = 0x14;
  }
  if (h / 6 < 0xf) {
    local_4c = h / 6;
  }
  else {
    local_4c = 0xf;
  }
  h_00 = h - (local_48 + local_4c);
  step_size_bottom = 0.0;
  if (local_48 < 2) {
    local_50 = 1.0;
  }
  else {
    local_50 = 0.999 / (float)local_48;
  }
  if (local_4c < 2) {
    local_54 = 1.0;
  }
  else {
    local_54 = 0.999 / (float)local_4c;
  }
  for (local_40 = 1.0; 0.0 <= local_40; local_40 = local_40 - local_50) {
    FVar1 = fl_color_average(fg1,fg2,th);
    FVar1 = fl_color_average(FVar1,fg1,local_40);
    gleam_color(FVar1);
    fl_xyline(x,y + (int)step_size_bottom,x + w);
    step_size_bottom = (float)((int)step_size_bottom + 1);
  }
  gleam_color(fg1);
  fl_rectf(x,y + local_48,w + 1,h_00);
  for (local_44 = 1.0; 0.0 <= local_44; local_44 = local_44 - local_54) {
    FVar1 = fl_color_average(fg1,fg2,th);
    FVar1 = fl_color_average(fg1,FVar1,local_44);
    gleam_color(FVar1);
    fl_xyline(x,y + (int)step_size_bottom + h_00 + -1,x + w);
    step_size_bottom = (float)((int)step_size_bottom + 1);
  }
  return;
}

Assistant:

static void shade_rect_top_bottom(int x, int y, int w, int h, Fl_Color fg1, Fl_Color fg2, float th) {
  // Draws the shiny using maximum limits
  int h_top    = ((h/2) < (20) ? (h/2) : (20)); // min(h/2,20);
  int h_bottom = ((h/6) < (15) ? (h/6) : (15)); // min(h/6,15);
  int h_flat = h-(h_top+h_bottom);
  int j = 0;
  float step_size_top = h_top>1?(0.999f/(float)(h_top)):1;
  float step_size_bottom = h_bottom>1?(0.999f/(float)(h_bottom)):1;
  // This loop generates the gradient at the top of the widget
  for (float k = 1; k >= 0; k -= step_size_top){
    gleam_color(fl_color_average(fl_color_average(fg1, fg2, th), fg1, k));
    fl_xyline(x, y+j, x+w);
    j++;
  }
  gleam_color(fg1);
  fl_rectf(x, y+h_top, w+1, h_flat);
  // This loop generates the gradient at the bottom of the widget
  for (float k = 1; k >= 0; k -= step_size_bottom){
    gleam_color(fl_color_average(fg1,fl_color_average(fg1, fg2, th), k));
    fl_xyline(x, y+j+h_flat-1, x+w);
    j++;
  }
}